

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_java_struct_result_writer
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  reference pptVar5;
  string *psVar6;
  string local_1a0;
  string local_180;
  string local_160;
  allocator local_139;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_98;
  t_field **local_90;
  byte local_81;
  const_iterator cStack_80;
  bool first;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_40);
  poVar4 = std::operator<<(poVar4,"public void write(TProtocol oprot) throws TException {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar3));
  f_iter._M_current = (t_field **)t_struct::get_sorted_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffff80);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"oprot.writeStructBegin(STRUCT_DESC);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_81 = 1;
  local_90 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_80 = (const_iterator)local_90;
  while( true ) {
    local_98._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff80,&local_98);
    if (!bVar2) break;
    if ((local_81 & 1) == 0) {
      std::operator<<((ostream *)tstruct_local," else if ");
    }
    else {
      local_81 = 0;
      poVar4 = std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_b8);
      std::operator<<(poVar4,"if ");
      std::__cxx11::string::~string((string *)&local_b8);
    }
    poVar4 = std::operator<<((ostream *)tstruct_local,"(this.");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff80);
    generate_isset_check_abi_cxx11_(&local_d8,this,*pptVar5);
    poVar4 = std::operator<<(poVar4,(string *)&local_d8);
    poVar4 = std::operator<<(poVar4,") {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"oprot.writeFieldBegin(");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff80);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_118,(string *)psVar6);
    constant_name(&local_f8,this,&local_118);
    poVar4 = std::operator<<(poVar4,(string *)&local_f8);
    poVar4 = std::operator<<(poVar4,"_FIELD_DESC);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff80);
    tfield = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"this.",&local_139);
    generate_serialize_field(this,(ostream *)ptVar1,tfield,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"oprot.writeFieldEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    std::operator<<(poVar4,"}");
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff80);
  }
  poVar4 = std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_160);
  poVar4 = std::operator<<(poVar4,"oprot.writeFieldStop();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_180);
  poVar4 = std::operator<<(poVar4,"oprot.writeStructEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_1a0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_result_writer(ostream& out, t_struct* tstruct) {
  out << indent() << "public void write(TProtocol oprot) throws TException {" << endl;
  indent_up();

  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "oprot.writeStructBegin(STRUCT_DESC);" << endl;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << endl << indent() << "if ";
    } else {
      out << " else if ";
    }

    out << "(this." << generate_isset_check(*f_iter) << ") {" << endl;

    indent_up();

    indent(out) << "oprot.writeFieldBegin(" << constant_name((*f_iter)->get_name())
                << "_FIELD_DESC);" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    // Write field closer
    indent(out) << "oprot.writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}";
  }
  // Write the struct map
  out << endl << indent() << "oprot.writeFieldStop();" << endl << indent()
      << "oprot.writeStructEnd();" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;
}